

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<deqp::gls::BuiltinPrecisionTests::Void> * deqp::gls::BuiltinPrecisionTests::voidP(void)

{
  int iVar1;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *ptr;
  
  if (voidP()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&voidP()::singleton);
    if (iVar1 != 0) {
      ptr = (Expr<deqp::gls::BuiltinPrecisionTests::Void> *)operator_new(0x10);
      (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_021b9688;
      exprP<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&voidP::singleton,ptr);
      __cxa_atexit(de::
                   SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                   ::~SharedPtr,&voidP::singleton,&__dso_handle);
      __cxa_guard_release(&voidP()::singleton);
    }
  }
  return &voidP::singleton;
}

Assistant:

const ExprP<Void>& voidP (void)
{
	static const ExprP<Void> singleton = constant(Void());

	return singleton;
}